

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool __thiscall tinyxml2::XMLElement::Accept(XMLElement *this,XMLVisitor *visitor)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  long *in_RSI;
  XMLNode *in_RDI;
  XMLNode *node;
  XMLNode *local_18;
  
  uVar3 = (**(code **)(*in_RSI + 0x20))(in_RSI,in_RDI,in_RDI[1]._document);
  if ((uVar3 & 1) != 0) {
    local_18 = XMLNode::FirstChild(in_RDI);
    while ((local_18 != (XMLNode *)0x0 &&
           (uVar2 = (*local_18->_vptr_XMLNode[0xe])(local_18,in_RSI), (uVar2 & 1) != 0))) {
      local_18 = XMLNode::NextSibling(local_18);
    }
  }
  bVar1 = (**(code **)(*in_RSI + 0x28))(in_RSI,in_RDI);
  return (bool)(bVar1 & 1);
}

Assistant:

bool XMLElement::Accept( XMLVisitor* visitor ) const
{
    TIXMLASSERT( visitor );
    if ( visitor->VisitEnter( *this, _rootAttribute ) ) {
        for ( const XMLNode* node=FirstChild(); node; node=node->NextSibling() ) {
            if ( !node->Accept( visitor ) ) {
                break;
            }
        }
    }
    return visitor->VisitExit( *this );
}